

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManPatDistImprove(Gia_Man_t *p,int fVerbose)

{
  Vec_Wrd_t *vPatterns;
  uint uVar1;
  Vec_Int_t *p_00;
  abctime aVar2;
  Vec_Int_t *vPat;
  Vec_Int_t *vThis;
  Gia_Man_t *p_01;
  abctime aVar3;
  uint uVar4;
  abctime time;
  int nWords;
  uint Iter;
  uint n;
  double dVar5;
  double dVar6;
  double local_70;
  double local_60;
  
  nWords = p->vSimsPi->nSize / p->vCis->nSize;
  p_00 = Gia_SimGenerateStats(p);
  vPatterns = p->vSimsPi;
  p->vSimsPi = (Vec_Wrd_t *)0x0;
  Abc_Random(1);
  n = 0;
  uVar4 = 0;
  if (0 < nWords << 6) {
    uVar4 = nWords << 6;
  }
  local_70 = 0.0;
  local_60 = 0.0;
  do {
    if (n == uVar4) {
      Vec_IntFree(p_00);
      if (fVerbose != 0) {
        putchar(10);
      }
      dVar5 = (double)(nWords << 6);
      printf("Improved %d patterns with average init value %.2f and average final value %.2f.\n",
             local_60 / dVar5,local_70 / dVar5);
      p->vSimsPi = vPatterns;
      return;
    }
    aVar2 = Abc_Clock();
    vPat = Gia_ManPatCollectOne(p,vPatterns,n,nWords);
    vThis = Gia_SimQualityOne(p,vPat,0);
    dVar5 = Gia_SimComputeScore(p,p_00,vThis);
    local_60 = local_60 + dVar5;
    Vec_IntFree(vThis);
    for (Iter = 0; Iter != 100; Iter = Iter + 1) {
      uVar1 = Gia_SimQualityPatternsMax(p,vPat,Iter,fVerbose,p_00);
      if (uVar1 == 0xffffffff) break;
      if (((int)uVar1 < 0) || (p->vCis->nSize <= (int)uVar1)) {
        __assert_fail("MaxIn >= 0 && MaxIn < Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                      ,0x6db,"void Gia_ManPatDistImprove(Gia_Man_t *, int)");
      }
      vPat->pArray[uVar1] = vPat->pArray[uVar1] ^ 1;
    }
    p_01 = (Gia_Man_t *)Gia_SimQualityOne(p,vPat,0);
    dVar6 = Gia_SimComputeScore(p,p_00,(Vec_Int_t *)p_01);
    Vec_IntFree((Vec_Int_t *)p_01);
    if (fVerbose != 0) {
      printf("Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ",dVar5,
             dVar6,dVar6 / dVar5,(ulong)n,(ulong)Iter);
      aVar3 = Abc_Clock();
      p_01 = (Gia_Man_t *)0x816bba;
      Abc_PrintTime(0x816bba,(char *)(aVar3 - aVar2),time);
    }
    local_70 = local_70 + dVar6;
    Gia_ManPatUpdateOne(p_01,vPatterns,n,nWords,vPat);
    Vec_IntFree(vPat);
    n = n + 1;
  } while( true );
}

Assistant:

void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose )
{
    int n, k, nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    double InitValue, InitTotal = 0, FinalValue, FinalTotal = 0;
    Vec_Int_t * vPat, * vRes, * vStats = Gia_SimGenerateStats( p );
    Vec_Wrd_t * vPatterns = p->vSimsPi; p->vSimsPi = NULL;
    Abc_Random(1);
    for ( n = 0; n < 64*nWords; n++ )
    {
        abctime clk = Abc_Clock();
//        if ( n == 32 )
//            break;

        vPat = Gia_ManPatCollectOne( p, vPatterns, n, nWords );
        vRes = Gia_SimQualityOne( p, vPat, 0 );
        InitValue = Gia_SimComputeScore(p, vStats, vRes);
        InitTotal += InitValue;
        Vec_IntFree( vRes );

        for ( k = 0; k < 100; k++ )
        {
            int MaxIn = Gia_SimQualityPatternsMax( p, vPat, k, fVerbose, vStats );
            if ( MaxIn == -1 )
                break;
            assert( MaxIn >= 0 && MaxIn < Gia_ManCiNum(p) );
            Vec_IntArray(vPat)[MaxIn] ^= 1;            
        }
        //Vec_IntPrint( vPat );

        vRes = Gia_SimQualityOne( p, vPat, 0 );
        FinalValue = Gia_SimComputeScore(p, vStats, vRes);
        FinalTotal += FinalValue;
        Vec_IntFree( vRes );

        if ( fVerbose )
        {
            printf( "Pat %5d : Tries = %5d  InitValue = %6.3f  FinalValue = %6.3f  Ratio = %4.2f  ", 
                n, k, InitValue, FinalValue, FinalValue/InitValue );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }

        Gia_ManPatUpdateOne( p, vPatterns, n, nWords, vPat );
        Vec_IntFree( vPat );
    }
    Vec_IntFree( vStats );
    if ( fVerbose )
        printf( "\n" );
    printf( "Improved %d patterns with average init value %.2f and average final value %.2f.\n", 
        64*nWords, 1.0*InitTotal/(64*nWords), 1.0*FinalTotal/(64*nWords) );
    p->vSimsPi = vPatterns;
}